

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
write_decimal<unsigned_int>(basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *this,uint value)

{
  ulong uVar1;
  undefined2 uVar2;
  buffer<wchar_t> *pbVar3;
  size_t sVar4;
  wchar_t *pwVar5;
  bool bVar6;
  undefined1 *puVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 uVar12;
  undefined1 auVar11 [16];
  undefined1 auStack_78 [80];
  
  uVar9 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar9 = (uVar9 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar10 = (ulong)((uVar9 - (value < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                              (ulong)uVar9 * 4))) + 1);
  pbVar3 = (this->out_).container;
  sVar4 = pbVar3->size_;
  uVar1 = sVar4 + uVar10;
  if (pbVar3->capacity_ < uVar1) {
    (**pbVar3->_vptr_buffer)(pbVar3,uVar1);
  }
  pbVar3->size_ = uVar1;
  puVar7 = auStack_78 + uVar10 * 4;
  uVar9 = value;
  if (99 < value) {
    do {
      value = uVar9 / 100;
      uVar2 = *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar9 % 100) * 2);
      uVar12 = (undefined1)((ushort)uVar2 >> 8);
      auVar11 = ZEXT416(CONCAT22((short)(CONCAT13(uVar12,CONCAT12(uVar12,uVar2)) >> 0x10),
                                 CONCAT11((char)uVar2,(char)uVar2)));
      auVar11 = pshuflw(auVar11,auVar11,0x60);
      *(ulong *)(puVar7 + -8) = CONCAT44(auVar11._4_4_ >> 0x18,auVar11._0_4_ >> 0x18);
      puVar7 = puVar7 + -8;
      bVar6 = 9999 < uVar9;
      uVar9 = uVar9 / 100;
    } while (bVar6);
  }
  pwVar5 = pbVar3->ptr_;
  if (value < 10) {
    uVar9 = value | 0x30;
    lVar8 = -4;
  }
  else {
    *(int *)(puVar7 + -4) = (int)(char)basic_data<void>::digits[((ulong)value * 2 & 0xffffffff) + 1]
    ;
    uVar9 = (uint)(char)basic_data<void>::digits[(ulong)value * 2];
    lVar8 = -8;
  }
  *(uint *)(puVar7 + lVar8) = uVar9;
  if (uVar10 != 0) {
    switchD_015ff80e::default(pwVar5 + sVar4,auStack_78,uVar10 << 2);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }